

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::FreezeImpl
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,bool isConvertedType)

{
  int *piVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar3;
  
  pDVar3 = SimpleTypeHandler<1ul>::
           ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>>
                     ((SimpleTypeHandler<1ul> *)this,instance);
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertSimpleToDictionaryCount;
  *piVar1 = *piVar1 + 1;
  UNRECOVERED_JUMPTABLE = (pDVar3->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[99];
  iVar2 = (*UNRECOVERED_JUMPTABLE)(pDVar3,instance,1,UNRECOVERED_JUMPTABLE);
  return iVar2;
}

Assistant:

BOOL SimpleTypeHandler<size>::FreezeImpl(DynamicObject* instance, bool isConvertedType)
    {
        return ConvertToDictionaryType(instance)->Freeze(instance, true);
    }